

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBox.cpp
# Opt level: O2

void __thiscall chrono::geometry::ChBox::ArchiveIN(ChBox *this,ChArchiveIn *marchive)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ChVector<double> Lengths;
  ChVector<double> local_48;
  ChNameValue<chrono::ChVector<double>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::geometry::ChBox>(marchive);
  ChVolume::ArchiveIN(&this->super_ChVolume,marchive);
  local_48.m_data[2] = 0.0;
  local_30._name = "Lengths";
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_30._flags = '\0';
  local_30._value = &local_48;
  ChArchiveIn::operator>>(marchive,&local_30);
  auVar1._8_8_ = local_48.m_data[1];
  auVar1._0_8_ = local_48.m_data[0];
  auVar2._8_8_ = 0x3fe0000000000000;
  auVar2._0_8_ = 0x3fe0000000000000;
  auVar2 = vmulpd_avx512vl(auVar1,auVar2);
  *(undefined1 (*) [16])(this->Size).m_data = auVar2;
  (this->Size).m_data[2] = local_48.m_data[2] * 0.5;
  return;
}

Assistant:

void ChBox::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChBox>();
    // deserialize parent class
    ChVolume::ArchiveIN(marchive);
    // stream in all member data:
    ChVector<> Lengths;
    marchive >> CHNVP(Lengths);  // avoid storing 'Size', i.e. half lengths, because less intuitive
    SetLengths(Lengths);
}